

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_hud.cpp
# Opt level: O2

void DrawOneWeapon(player_t *CPlayer,int x,int *y,AWeapon *weapon)

{
  FTexture *tex;
  bool bVar1;
  FTextureID FVar2;
  AWeapon *pAVar3;
  PClass *base;
  int y_00;
  int h;
  int trans;
  
  if (((weapon->super_AInventory).field_0x4dd & 4) == 0) {
    pAVar3 = GC::ReadBarrier<AWeapon>((AWeapon **)&weapon->SisterWeapon);
    if (pAVar3 != (AWeapon *)0x0) {
      pAVar3 = GC::ReadBarrier<AWeapon>((AWeapon **)&weapon->SisterWeapon);
      base = DObject::GetClass((DObject *)pAVar3);
      bVar1 = DObject::IsKindOf((DObject *)weapon,base);
      if (bVar1) {
        return;
      }
    }
    pAVar3 = CPlayer->ReadyWeapon;
    trans = 0x6666;
    if ((pAVar3 != (AWeapon *)0x0) &&
       ((pAVar3 == weapon ||
        (pAVar3 = GC::ReadBarrier<AWeapon>((AWeapon **)&pAVar3->SisterWeapon), pAVar3 == weapon))))
    {
      trans = 0xd999;
    }
    h = 0x10;
    FVar2 = GetInventoryIcon(&weapon->super_AInventory,0x10,(bool *)0x0);
    if (0 < FVar2.texnum) {
      tex = TexMan.Textures.Array[(uint)FVar2.texnum].Texture;
      y_00 = *y;
      if (tex->Height < tex->Width) {
        h = 8;
      }
      else {
        y_00 = y_00 + -8;
        *y = y_00;
      }
      DrawImageToBox(tex,x + -0x18,y_00,0x14,h,trans);
      *y = *y + -10;
    }
  }
  return;
}

Assistant:

static void DrawOneWeapon(player_t * CPlayer, int x, int & y, AWeapon * weapon)
{
	int trans;

	// Powered up weapons and inherited sister weapons are not displayed.
	if (weapon->WeaponFlags & WIF_POWERED_UP) return;
	if (weapon->SisterWeapon && weapon->IsKindOf(weapon->SisterWeapon->GetClass())) return;

	trans=0x6666;
	if (CPlayer->ReadyWeapon)
	{
		if (weapon==CPlayer->ReadyWeapon || weapon==CPlayer->ReadyWeapon->SisterWeapon) trans=0xd999;
	}

	FTextureID picnum = GetInventoryIcon(weapon, DI_ALTICONFIRST);

	if (picnum.isValid())
	{
		FTexture * tex = TexMan[picnum];
		int w = tex->GetWidth();
		int h = tex->GetHeight();
		int rh;
		if (w>h) rh=8;
		else rh=16,y-=8;		// don't draw tall sprites too small!
		DrawImageToBox(tex, x-24, y, 20, rh, trans);
		y-=10;
	}
}